

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void correctstack(lua_State *L,StkId oldstack)

{
  UpVal *pUVar1;
  CallInfo *pCVar2;
  
  pUVar1 = L->openupval;
  (L->top).p = (StkId)((long)(L->top).p + (long)(L->stack).p);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p + (long)(L->stack).p);
  for (; pUVar1 != (UpVal *)0x0; pUVar1 = (pUVar1->u).open.next) {
    (pUVar1->v).p = (TValue *)((long)&((pUVar1->v).p)->value_ + (long)(L->stack).p);
  }
  for (pCVar2 = L->ci; pCVar2 != (CallInfo *)0x0; pCVar2 = pCVar2->previous) {
    (pCVar2->top).p = (StkId)((long)(pCVar2->top).p + (long)(L->stack).p);
    (pCVar2->func).p = (StkId)((long)(pCVar2->func).p + (long)(L->stack).p);
    if ((pCVar2->callstatus & 0x8000) == 0) {
      (pCVar2->u).l.trap = 1;
    }
  }
  return;
}

Assistant:

static void correctstack (lua_State *L, StkId oldstack) {
  CallInfo *ci;
  UpVal *up;
  UNUSED(oldstack);
  L->top.p = restorestack(L, L->top.offset);
  L->tbclist.p = restorestack(L, L->tbclist.offset);
  for (up = L->openupval; up != NULL; up = up->u.open.next)
    up->v.p = s2v(restorestack(L, up->v.offset));
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    ci->top.p = restorestack(L, ci->top.offset);
    ci->func.p = restorestack(L, ci->func.offset);
    if (isLua(ci))
      ci->u.l.trap = 1;  /* signal to update 'trap' in 'luaV_execute' */
  }
}